

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O0

Value * __thiscall
soul::heart::ArrayElement::getAsConstant(Value *__return_storage_ptr__,ArrayElement *this)

{
  bool bVar1;
  Expression *pEVar2;
  Type *this_00;
  SubElementPath local_120;
  size_t local_e8;
  int64_t index;
  Value indexValue;
  undefined1 local_58 [8];
  Value parentValue;
  ArrayElement *this_local;
  
  parentValue.allocatedData.allocatedData.space[0] = (uint64_t)this;
  pEVar2 = pool_ref<soul::heart::Expression>::operator->(&this->parent);
  (*(pEVar2->super_Object)._vptr_Object[7])();
  bVar1 = soul::Value::isValid((Value *)local_58);
  if (bVar1) {
    this_00 = soul::Value::getType((Value *)local_58);
    bVar1 = Type::isUnsizedArray(this_00);
    if (!bVar1) {
      bVar1 = isSlice(this);
      if (bVar1) {
        soul::Value::getSlice
                  (__return_storage_ptr__,(Value *)local_58,this->fixedStartIndex,
                   this->fixedEndIndex);
        goto LAB_0041deaa;
      }
      bVar1 = pool_ptr<soul::heart::Expression>::operator==(&this->dynamicIndex,(void *)0x0);
      if (bVar1) {
        SubElementPath::SubElementPath
                  ((SubElementPath *)indexValue.allocatedData.allocatedData.space,
                   this->fixedStartIndex);
        soul::Value::getSubElement
                  (__return_storage_ptr__,(Value *)local_58,
                   (SubElementPath *)indexValue.allocatedData.allocatedData.space);
        SubElementPath::~SubElementPath
                  ((SubElementPath *)indexValue.allocatedData.allocatedData.space);
        goto LAB_0041deaa;
      }
      pEVar2 = pool_ptr<soul::heart::Expression>::operator->(&this->dynamicIndex);
      (*(pEVar2->super_Object)._vptr_Object[7])(&index);
      bVar1 = soul::Value::isValid((Value *)&index);
      if ((bVar1) && (local_e8 = soul::Value::getAsInt64((Value *)&index), -1 < (long)local_e8)) {
        SubElementPath::SubElementPath(&local_120,local_e8);
        soul::Value::getSubElement(__return_storage_ptr__,(Value *)local_58,&local_120);
        SubElementPath::~SubElementPath(&local_120);
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
      soul::Value::~Value((Value *)&index);
      if (bVar1) goto LAB_0041deaa;
    }
  }
  soul::Value::Value(__return_storage_ptr__);
LAB_0041deaa:
  soul::Value::~Value((Value *)local_58);
  return __return_storage_ptr__;
}

Assistant:

Value getAsConstant() const override
        {
            auto parentValue = parent->getAsConstant();

            if (parentValue.isValid() && ! parentValue.getType().isUnsizedArray())
            {
                if (isSlice())
                    return parentValue.getSlice (fixedStartIndex, fixedEndIndex);

                if (dynamicIndex == nullptr)
                    return parentValue.getSubElement (fixedStartIndex);

                auto indexValue = dynamicIndex->getAsConstant();

                if (indexValue.isValid())
                {
                    auto index = indexValue.getAsInt64();

                    if (index >= 0)
                        return parentValue.getSubElement ((size_t) index);
                }
            }

            return {};
        }